

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits,uint32_t page_size)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  Result RVar6;
  Enum EVar7;
  Location loc;
  MemoryDesc local_50;
  
  loc.field_1._8_8_ = loc.field_1._8_8_ & 0xffffffff00000000;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar6 = SharedValidator::OnMemory(&this->validator_,&loc,limits,page_size);
  if (RVar6.enum_ == Error) {
    EVar7 = Error;
  }
  else {
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)limits->initial;
    loc.field_1._8_8_ = limits->max;
    bVar1 = limits->has_max;
    bVar2 = limits->is_shared;
    bVar3 = limits->is_64;
    uVar4 = limits->field_0x17;
    uVar5 = *(undefined4 *)&limits->field_0x13;
    loc.filename._M_str = (char *)CONCAT44(loc.filename._M_str._4_4_,2);
    loc.filename._M_len = (size_t)&PTR__ExternType_001e6c40;
    if ((bVar1 & 1U) == 0) {
      loc.field_1._8_8_ = WABT_BYTES_TO_MIN_PAGES(-(ulong)(bVar3 & 1) | 0xffffffff,page_size);
    }
    local_50.type.super_ExternType.kind = Memory;
    local_50.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001e6c40;
    local_50.type.limits.initial = (uint64_t)loc.field_1.field_1.offset;
    local_50.type.limits.max = loc.field_1._8_8_;
    local_50.type.limits.has_max = bVar1;
    local_50.type.limits.is_shared = bVar2;
    local_50.type.limits.is_64 = bVar3;
    local_50.type.limits._19_4_ = uVar5;
    local_50.type.limits._23_1_ = uVar4;
    local_50.type.page_size = page_size;
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::
    emplace_back<wabt::interp::MemoryDesc>(&this->module_->memories,&local_50);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)&loc);
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index,
                                    const Limits* limits,
                                    uint32_t page_size) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *limits, page_size));
  MemoryType memory_type{*limits, page_size};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}